

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall gl4cts::DirectStateAccess::Framebuffers::BlitTest::CheckColor(BlitTest *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  float fVar4;
  MessageBuilder local_218;
  uint local_94;
  uint local_90;
  GLuint k;
  GLuint i;
  GLuint j;
  GLfloat color [2] [3] [4];
  Functions *gl;
  BlitTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  memset(&i,0,0x60);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1220))(0,0,3,2,0x1908,0x1406,&i);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xb5b);
  k = 0;
  do {
    if (1 < k) {
      return true;
    }
    for (local_90 = 0; local_90 < 3; local_90 = local_90 + 1) {
      for (local_94 = 0; local_94 < 4; local_94 = local_94 + 1) {
        fVar4 = de::abs<float>(CheckColor::reference[k][local_90][local_94] -
                               (float)(&i)[(ulong)k * 0xc + (ulong)local_90 * 4 + (ulong)local_94]);
        if (0.015625 < fVar4) {
          this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          this_01 = tcu::TestContext::getLog(this_00);
          tcu::TestLog::operator<<(&local_218,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar3 = tcu::MessageBuilder::operator<<
                             (&local_218,
                              (char (*) [45])"Blitted framebuffer color buffer contains [[");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)&i);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)&j);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)color);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[0][0] + 1);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])"], [");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[0][0] + 2);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[0][0] + 3);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[0][1]);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[0][1] + 1);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])"], [");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[0][1] + 2);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[0][1] + 3);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[0][2]);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[0][2] + 1);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])"],\n[");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[0][2] + 2);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[0][2] + 3);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)(color + 1));
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[1][0] + 1);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])"], [");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[1][0] + 2);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[1][0] + 3);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[1][1]);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[1][1] + 1);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])"], [");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[1][1] + 2);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[1][1] + 3);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[1][2]);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,color[1][2] + 1);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])"]], but\n");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)CheckColor::reference);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][0] + 1);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][0] + 2);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][0] + 3);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])"], [");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][1]);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][1] + 1);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][1] + 2);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][1] + 3);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])"], [");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][2]);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][2] + 1);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][2] + 2);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][2] + 3);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])"],\n[");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)(CheckColor::reference + 1));
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][0] + 1);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][0] + 2);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][0] + 3);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])"], [");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][1]);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][1] + 1);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][1] + 2);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][1] + 3);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])"], [");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][2]);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][2] + 1);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][2] + 2);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][2] + 3);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [18])"]] was expected.\n");
          tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_218);
          return false;
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

bool BlitTest::CheckColor()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reference values. */
	static const glw::GLfloat reference[2][3][4] = {
		{ { 1.f, 0.f, 0.f, 1.f }, { 0.f, 1.f, 0.f, 1.f }, { 0.f, 0.f, 1.f, 1.f } },
		{ { 1.f, 1.f, 0.f, 1.f }, { 1.f, 1.f, 0.f, 1.f }, { 1.f, 1.f, 0.f, 1.f } }
	};

	/* Copy buffer. */
	glw::GLfloat color[2][3][4] = { { { 0 } } };

	/* Reading from GL. */
	gl.readPixels(0, 0, 3, 2, GL_RGBA, GL_FLOAT, color);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison against the reference. */
	for (glw::GLuint j = 0; j < 2; ++j)
	{
		for (glw::GLuint i = 0; i < 3; ++i)
		{
			for (glw::GLuint k = 0; k < 4; ++k)
			{
				if (de::abs(reference[j][i][k] - color[j][i][k]) > (1.f / 64.f) /* Precision. */)
				{
					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Blitted framebuffer color buffer contains [[" << color[0][0][0]
						<< ", " << color[0][0][1] << ", " << color[0][0][2] << ", " << color[0][0][3] << "], ["
						<< color[0][1][0] << ", " << color[0][1][1] << ", " << color[0][1][2] << ", " << color[0][1][3]
						<< "], [" << color[0][2][0] << ", " << color[0][2][1] << ", " << color[0][2][2] << ", "
						<< color[0][2][3] << "],\n[" << color[1][0][0] << ", " << color[1][0][1] << ", "
						<< color[1][0][2] << ", " << color[1][0][3] << "], [" << color[1][1][0] << ", "
						<< color[1][1][1] << ", " << color[1][1][2] << ", " << color[1][1][3] << "], ["
						<< color[1][2][0] << ", " << color[1][2][1] << ", " << color[1][2][2] << ", " << color[1][2][3]
						<< "]], but\n"
						<< reference[0][0][0] << ", " << reference[0][0][1] << ", " << reference[0][0][2] << ", "
						<< reference[0][0][3] << "], [" << reference[0][1][0] << ", " << reference[0][1][1] << ", "
						<< reference[0][1][2] << ", " << reference[0][1][3] << "], [" << reference[0][2][0] << ", "
						<< reference[0][2][1] << ", " << reference[0][2][2] << ", " << reference[0][2][3] << "],\n["
						<< reference[1][0][0] << ", " << reference[1][0][1] << ", " << reference[1][0][2] << ", "
						<< reference[1][0][3] << "], [" << reference[1][1][0] << ", " << reference[1][1][1] << ", "
						<< reference[1][1][2] << ", " << reference[1][1][3] << "], [" << reference[1][2][0] << ", "
						<< reference[1][2][1] << ", " << reference[1][2][2] << ", " << reference[1][2][3]
						<< "]] was expected.\n"
						<< tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}